

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall
argparse::ArgumentParser::ArgumentParser
          (ArgumentParser *this,string *aProgramName,string *aVersion,default_arguments aArgs)

{
  bool bVar1;
  undefined1 uVar2;
  enable_if_t<std::is_invocable_v<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MW55[P]DNA_Aeon_cpp_single_include_argparse_hpp:844:33),_const_std::string>,_Argument_&>
  this_00;
  Argument *pAVar3;
  ArgumentParser *in_RDX;
  char *in_RDI;
  string *in_stack_fffffffffffffe78;
  Argument *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  int aNumArgs;
  Argument *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  Argument *in_stack_fffffffffffffeb8;
  Argument *in_stack_fffffffffffffec0;
  Argument *in_stack_fffffffffffffee0;
  char *Fargs;
  allocator<char> local_b1 [40];
  undefined1 local_89;
  default_arguments local_80;
  undefined1 local_79;
  allocator<char> local_61 [40];
  undefined1 local_39;
  default_arguments local_20;
  default_arguments local_1c [7];
  
  Fargs = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::string(in_stack_fffffffffffffe90);
  std::__cxx11::string::string(in_stack_fffffffffffffe90);
  in_RDI[0x80] = '\0';
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)0x1878eb);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)0x187907);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
         *)0x187923);
  local_20 = help;
  bVar1 = operator&(local_1c,&local_20);
  if (bVar1) {
    in_stack_fffffffffffffee0 =
         add_argument<char_const*,char_const*>(in_RDX,Fargs,(char *)in_stack_fffffffffffffee0);
    Argument::
    action<argparse::ArgumentParser::ArgumentParser(std::__cxx11::string,std::__cxx11::string,argparse::default_arguments)::_lambda(auto:1_const&)_1_>
              (in_stack_fffffffffffffe80,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe78);
    local_39 = 0;
    Argument::default_value<bool>(in_stack_fffffffffffffea0,(bool *)in_stack_fffffffffffffe98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    in_stack_fffffffffffffec0 = Argument::help(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_79 = 1;
    std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>
              ((any *)in_stack_fffffffffffffe80,(bool *)in_stack_fffffffffffffe78);
    in_stack_fffffffffffffeb8 =
         Argument::implicit_value(in_stack_fffffffffffffe80,(any *)in_stack_fffffffffffffe78);
    Argument::nargs(in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    std::any::~any((any *)0x187a5b);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe80);
    std::allocator<char>::~allocator(local_61);
  }
  local_80 = version;
  uVar2 = operator&(local_1c,&local_80);
  if ((bool)uVar2) {
    add_argument<char_const*,char_const*>(in_RDX,Fargs,(char *)in_stack_fffffffffffffee0);
    this_00 = Argument::
              action<argparse::ArgumentParser::ArgumentParser(std::__cxx11::string,std::__cxx11::string,argparse::default_arguments)::_lambda(auto:1_const&)_2_>
                        (in_stack_fffffffffffffe80,
                         (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe78);
    local_89 = 0;
    pAVar3 = Argument::default_value<bool>(this_00,(bool *)in_stack_fffffffffffffe98);
    aNumArgs = (int)((ulong)pAVar3 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
               (allocator<char> *)CONCAT17(uVar2,in_stack_fffffffffffffeb0));
    Argument::help(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>
              ((any *)in_stack_fffffffffffffe80,(bool *)in_stack_fffffffffffffe78);
    pAVar3 = Argument::implicit_value(in_stack_fffffffffffffe80,(any *)in_stack_fffffffffffffe78);
    Argument::nargs(this_00,aNumArgs);
    std::any::~any((any *)0x187c31);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3);
    std::allocator<char>::~allocator(local_b1);
  }
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {},
                                std::string aVersion = "1.0",
                                default_arguments aArgs = default_arguments::all)
                : mProgramName(std::move(aProgramName)), mVersion(std::move(aVersion)) {
            if (aArgs & default_arguments::help) {
                add_argument("-h", "--help")
                        .action([&](const auto &) {
                            std::cout << help().str();
                            std::exit(0);
                        })
                        .default_value(false)
                        .help("shows help message and exits")
                        .implicit_value(true)
                        .nargs(0);
            }
            if (aArgs & default_arguments::version) {
                add_argument("-v", "--version")
                        .action([&](const auto &) {
                            std::cout << mVersion;
                            std::exit(0);
                        })
                        .default_value(false)
                        .help("prints version information and exits")
                        .implicit_value(true)
                        .nargs(0);
            }
        }